

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

int isEndChunkEmpty(EndNoise *en,SurfaceNoise *sn,uint64_t seed,int chunkX,int chunkZ)

{
  double *pdVar1;
  double *pdVar2;
  float *pfVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int z;
  uint uVar9;
  int iVar10;
  long lVar11;
  int *piVar12;
  long lVar13;
  int x;
  ulong uVar14;
  uint z_00;
  int iVar15;
  long lVar16;
  float fVar17;
  double dVar18;
  double dVar19;
  double depth [3] [3];
  int local_43c;
  float y [256];
  
  uVar7 = chunkX * 2;
  uVar8 = chunkZ * 2;
  x = chunkX * 0x10;
  z = chunkZ * 0x10;
  iVar10 = -1;
  do {
    if (iVar10 == 2) {
      for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
        uVar9 = uVar7 | (uint)lVar11;
        for (lVar16 = 0; lVar13 = 8, lVar16 != 2; lVar16 = lVar16 + 1) {
          z_00 = uVar8 | (uint)lVar16;
          fVar17 = getEndHeightNoise(en,uVar9,z_00,0);
          dVar18 = (double)(fVar17 + -8.0);
          depth[lVar11][lVar16] = dVar18;
          while (lVar13 != 0xf) {
            dVar19 = sampleSurfaceNoiseBetween
                               (sn,uVar9,(int)lVar13,z_00,
                                (isEndChunkEmpty::inverse_drop[lVar13] - dVar18) + -0.001,
                                (isEndChunkEmpty::inverse_drop[lVar13] - dVar18) + 0.001);
            pdVar2 = isEndChunkEmpty::upper_drop + lVar13;
            pdVar1 = isEndChunkEmpty::lower_drop + lVar13;
            lVar13 = lVar13 + 1;
            if (0.0 < ((dVar19 + dVar18 + 3000.0) * *pdVar2 + -3000.0 + 30.0) * *pdVar1 + -30.0) {
              return 0;
            }
          }
        }
      }
      uVar9 = uVar7;
      for (lVar11 = 0x10; lVar11 != 0x58; lVar11 = lVar11 + 0x18) {
        fVar17 = getEndHeightNoise(en,uVar9,uVar8 + 2,0);
        *(double *)((long)depth[0] + lVar11) = (double)(fVar17 + -8.0);
        uVar9 = uVar9 + 1;
      }
      for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
        fVar17 = getEndHeightNoise(en,uVar7 + 2,uVar8 | (uint)lVar11,0);
        depth[2][lVar11] = (double)(fVar17 + -8.0);
      }
      lVar11 = 0;
      do {
        if (lVar11 == 3) {
          return 1;
        }
        for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
          dVar18 = depth[lVar11][lVar16];
          lVar13 = 2;
          while (lVar13 != 0x12) {
            dVar19 = isEndChunkEmpty::inverse_drop[lVar13] - dVar18;
            dVar19 = sampleSurfaceNoiseBetween
                               (sn,uVar7 + (int)lVar11,(int)lVar13,uVar8 + (int)lVar16,
                                dVar19 + -0.001,dVar19 + 0.001);
            pdVar2 = isEndChunkEmpty::upper_drop + lVar13;
            pdVar1 = isEndChunkEmpty::lower_drop + lVar13;
            lVar13 = lVar13 + 1;
            if (0.0 < ((dVar19 + dVar18 + 3000.0) * *pdVar2 + -3000.0 + 30.0) * *pdVar1 + -30.0) {
              mapEndSurfaceHeight(y,en,sn,x,z,0x10,0x10,1,0);
              lVar11 = 0;
              while( true ) {
                if (lVar11 == 0x100) {
                  return 1;
                }
                pfVar3 = y + lVar11;
                lVar11 = lVar11 + 1;
                if (*pfVar3 != 0.0) break;
                if (NAN(*pfVar3)) {
                  return 0;
                }
              }
              return 0;
            }
          }
        }
        lVar11 = lVar11 + 1;
      } while( true );
    }
    for (iVar15 = -1; iVar15 != 2; iVar15 = iVar15 + 1) {
      uVar9 = getEndIslands((EndIsland *)y,en->mc,seed,iVar15 + chunkX,iVar10 + chunkZ);
      uVar14 = (ulong)uVar9;
      piVar12 = &local_43c + uVar14 * 4;
      for (; 0 < (long)uVar14; uVar14 = uVar14 - 1) {
        iVar4 = piVar12[-3];
        iVar5 = *piVar12;
        if ((((x < iVar5 + iVar4) && (iVar6 = piVar12[-1], z < iVar6 + iVar5)) &&
            (iVar4 - iVar5 <= x + 0xf)) &&
           ((iVar6 - iVar5 <= z + 0xf &&
            (mapEndBiome(en,(int *)depth,iVar4 >> 4,iVar6 >> 4,1,1), depth[0][0]._0_4_ == 0x28)))) {
          return 0;
        }
        piVar12 = piVar12 + -4;
      }
    }
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

int isEndChunkEmpty(const EndNoise *en, const SurfaceNoise *sn, uint64_t seed,
    int chunkX, int chunkZ)
{
    int i, j, k;
    int x = chunkX * 2;
    int z = chunkZ * 2;
    double depth[3][3];
    float y[256];

    // check if small end islands intersect this chunk
    for (j = -1; j <= +1; j++)
    {
        for (i = -1; i <= +1; i++)
        {
            EndIsland is[2];
            int n = getEndIslands(is, en->mc, seed, chunkX+i, chunkZ+j);
            while (n --> 0)
            {
                if (is[n].x + is[n].r <= chunkX*16) continue;
                if (is[n].z + is[n].r <= chunkZ*16) continue;
                if (is[n].x - is[n].r > chunkX*16 + 15) continue;
                if (is[n].z - is[n].r > chunkZ*16 + 15) continue;
                int id;
                mapEndBiome(en, &id, is[n].x >> 4, is[n].z >> 4, 1, 1);
                if (id == small_end_islands)
                    return 0;
            }
        }
    }

    // clamped (32 + 46 - y) / 64.0
    static const double upper_drop[] = {
           1.0,    1.0,    1.0,    1.0,    1.0,    1.0,    1.0,    1.0, // 0-7
           1.0,    1.0,    1.0,    1.0,    1.0,    1.0,    1.0, 63./64, // 8-15
        62./64, 61./64, 60./64, 59./64, 58./64, 57./64, 56./64, 55./64, // 16-23
        54./64, 53./64, 52./64, 51./64, 50./64, 49./64, 48./64, 47./64, // 24-31
        46./64 // 32
    };
    // clamped (y - 1) / 7.0
    static const double lower_drop[] = {
          0.0,  0.0, 1./7, 2./7, 3./7, 4./7, 5./7, 6./7, // 0-7
          1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0, // 8-15
          1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0, // 16-23
          1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0, // 24-31
          1.0, // 32
    };
    // inverse of clamping func: ( 30 * (1-l) / l + 3000 * (1-u) ) / u
    static const double inverse_drop[] = {
        1e9, 1e9, 180.0, 75.0, 40.0, 22.5, 12.0, 5.0, // 0-7
        0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, // 8-14
        1000./21, 3000./31, 9000./61, 200.0, // 15-18
    };
    const double eps = 0.001;

    // get the inner depth values and see if they imply blocks in the chunk
    for (i = 0; i < 2; i++)
    {
        for (j = 0; j < 2; j++)
        {
            depth[i][j] = getEndHeightNoise(en, x+i, z+j, 0) - 8.0f;
            for (k = 8; k <= 14; k++)
            {
                double u = upper_drop[k];
                double l = lower_drop[k];
                double noise = depth[i][j];
                double pivot = inverse_drop[k] - noise;
                noise += sampleSurfaceNoiseBetween(sn, x+i, k, z+j, pivot-eps, pivot+eps);
                noise = lerp(u, -3000, noise);
                noise = lerp(l, -30, noise);
                if (noise > 0)
                    return 0;
            }
        }
    }

    // fill in the depth values at the boundaries to neighbouring chunks
    for (i = 0; i < 3; i++)
        depth[i][2] = getEndHeightNoise(en, x+i, z+2, 0) - 8.0f;
    for (j = 0; j < 2; j++)
        depth[2][j] = getEndHeightNoise(en, x+2, z+j, 0) - 8.0f;

    // see if none of the noise values can generate blocks
    for (i = 0; i < 3; i++)
    {
        for (j = 0; j < 3; j++)
        {
            for (k = 2; k < 18; k++)
            {
                double u = upper_drop[k];
                double l = lower_drop[k];
                double noise = depth[i][j];
                double pivot = inverse_drop[k] - noise;
                noise += sampleSurfaceNoiseBetween(sn, x+i, k, z+j, pivot-eps, pivot+eps);
                noise = lerp(u, -3000, noise);
                noise = lerp(l, -30, noise);
                if (noise > 0)
                    goto L_check_full;
            }
        }
    }
    return 1;

L_check_full:
    mapEndSurfaceHeight(y, en, sn, chunkX*16, chunkZ*16, 16, 16, 1, 0);
    for (k = 0; k < 256; k++)
        if (y[k] != 0) return 0;
    return 1;
}